

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_1f926d::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_3_2::Rgba> *p1,RgbaChannels channels
               ,LineOrder lorder,Compression comp)

{
  bool bVar1;
  int iVar2;
  RgbaChannels width_00;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  void *this;
  int *piVar6;
  Rgba *pRVar7;
  float *pfVar8;
  Vec2<float> *v;
  Array2D<Imf_3_2::Rgba> *in_RCX;
  int in_EDX;
  int in_ESI;
  char *pcVar9;
  char *in_RDI;
  RgbaChannels in_R8D;
  int in_R9D;
  float fVar10;
  float fVar11;
  int in_stack_00000008;
  int x;
  int y;
  Array2D<Imf_3_2::Rgba> p2;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in;
  int numWrite;
  int numLeft;
  RgbaOutputFile out;
  Header header;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffdf8;
  RgbaChannels RVar12;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int local_110;
  int local_10c;
  Vec2<float> local_108;
  Array2D<Imf_3_2::Rgba> local_100;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int *local_d8;
  Rgba local_d0 [8];
  int local_90;
  int local_8c;
  RgbaOutputFile local_88 [4];
  RgbaChannels in_stack_ffffffffffffff7c;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff80;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Vec2<float> local_60;
  Header local_58 [56];
  int local_20;
  RgbaChannels local_1c;
  Array2D<Imf_3_2::Rgba> *local_18;
  int local_10;
  int local_c;
  char *local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar9 = "";
  if ((local_1c & WRITE_R) != 0) {
    pcVar9 = "R";
  }
  poVar5 = std::operator<<(poVar5,pcVar9);
  pcVar9 = "";
  if ((local_1c & WRITE_G) != 0) {
    pcVar9 = "G";
  }
  poVar5 = std::operator<<(poVar5,pcVar9);
  pcVar9 = "";
  if ((local_1c & WRITE_B) != 0) {
    pcVar9 = "B";
  }
  poVar5 = std::operator<<(poVar5,pcVar9);
  pcVar9 = "";
  if ((local_1c & WRITE_A) != 0) {
    pcVar9 = "A";
  }
  poVar5 = std::operator<<(poVar5,pcVar9);
  poVar5 = std::operator<<(poVar5,", line order ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20);
  poVar5 = std::operator<<(poVar5,", compression ");
  this = (void *)std::ostream::operator<<(poVar5,in_stack_00000008);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  iVar2 = local_10;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_2::Header::Header
            (local_58,local_c,iVar2,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar6 = (int *)Imf_3_2::Header::lineOrder();
  *piVar6 = local_20;
  piVar6 = (int *)Imf_3_2::Header::compression();
  *piVar6 = in_stack_00000008;
  remove(local_8);
  pcVar9 = local_8;
  RVar12 = local_1c;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile(local_88,pcVar9,local_58,RVar12,iVar2);
  pRVar7 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,0);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)local_88,(ulong)pRVar7,1);
  local_90 = 1;
  for (local_8c = local_10; RVar12 = (RgbaChannels)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
      local_8c != 0; local_8c = local_8c - local_90) {
    fVar10 = (float)Imath_3_2::Rand32::nextf();
    local_90 = (int)(fVar10 * (float)local_8c + 0.5);
    Imf_3_2::RgbaOutputFile::writePixels((int)local_88);
  }
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(local_88);
  pcVar9 = local_8;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_d0,pcVar9,iVar2);
  local_d8 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  local_dc = (local_d8[2] - *local_d8) + 1;
  local_e0 = (local_d8[3] - local_d8[1]) + 1;
  local_e4 = *local_d8;
  local_e8 = local_d8[1];
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
             ,CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  pRVar7 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)-local_e8);
  Imf_3_2::RgbaInputFile::setFrameBuffer(local_d0,(ulong)(pRVar7 + -local_e4),1);
  Imf_3_2::RgbaInputFile::readPixels((int)local_d0,local_d8[1]);
  Imf_3_2::RgbaInputFile::displayWindow();
  Imf_3_2::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
  if (!bVar1) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6b,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  Imf_3_2::RgbaInputFile::dataWindow();
  Imf_3_2::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
  if (!bVar1) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6c,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar10 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  pfVar8 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar10 != *pfVar8) || (NAN(fVar10) || NAN(*pfVar8))) {
    __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6d,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  Imf_3_2::RgbaInputFile::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(&local_108,v);
  if (!bVar1) {
    __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6e,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar10 = (float)Imf_3_2::RgbaInputFile::screenWindowWidth();
  pfVar8 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar10 != *pfVar8) || (NAN(fVar10) || NAN(*pfVar8))) {
    __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x6f,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = Imf_3_2::RgbaInputFile::lineOrder();
  piVar6 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar2 != *piVar6) {
    __assert_fail("in.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                  ,0x70,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = Imf_3_2::RgbaInputFile::compression();
  piVar6 = (int *)Imf_3_2::Header::compression();
  if (iVar2 == *piVar6) {
    width_00 = Imf_3_2::RgbaInputFile::channels();
    if (width_00 != local_1c) {
      __assert_fail("in.channels () == channels",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                    ,0x72,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    iVar2 = Imf_3_2::RgbaInputFile::compression();
    if ((iVar2 == 6) || (iVar3 = Imf_3_2::RgbaInputFile::compression(), iVar3 == 7)) {
      compareB44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else {
      iVar4 = Imf_3_2::RgbaInputFile::compression();
      if ((iVar4 == 8) ||
         (in_stack_fffffffffffffe04 = Imf_3_2::RgbaInputFile::compression(),
         in_stack_fffffffffffffe04 == 9)) {
        compareDwa(width_00,iVar2,(Array2D<Imf_3_2::Rgba> *)CONCAT44(iVar3,iVar4),
                   (Array2D<Imf_3_2::Rgba> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),RVar12);
      }
      else {
        for (local_10c = 0; local_10c < local_e0; local_10c = local_10c + 1) {
          for (local_110 = 0; local_110 < local_dc; local_110 = local_110 + 1) {
            if ((local_1c & WRITE_R) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != 0.0) || (NAN(fVar10))) {
                __assert_fail("p2[y][x].r == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x88,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_10c);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x86,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            if ((local_1c & WRITE_G) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != 0.0) || (NAN(fVar10))) {
                __assert_fail("p2[y][x].g == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x8d,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_10c);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x8b,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            if ((local_1c & WRITE_B) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != 0.0) || (NAN(fVar10))) {
                __assert_fail("p2[y][x].b == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x92,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_10c);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x90,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            if ((local_1c & WRITE_A) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((fVar10 != 1.0) || (NAN(fVar10))) {
                __assert_fail("p2[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x97,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_100,(long)local_10c);
              in_stack_fffffffffffffdc4 =
                   Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
              ;
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_10c);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
              if ((in_stack_fffffffffffffdc4 != fVar10) ||
                 (NAN(in_stack_fffffffffffffdc4) || NAN(fVar10))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                              ,0x95,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
          }
        }
      }
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
              ((Array2D<Imf_3_2::Rgba> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_d0);
    remove(local_8);
    Imf_3_2::Header::~Header(local_58);
    return;
  }
  __assert_fail("in.compression () == header.compression ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                ,0x71,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    RgbaChannels         channels,
    LineOrder            lorder,
    Compression          comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & WRITE_R) ? "R" : "")
         << ((channels & WRITE_G) ? "G" : "")
         << ((channels & WRITE_B) ? "B" : "")
         << ((channels & WRITE_A) ? "A" : "") << ", line order " << lorder
         << ", compression " << comp << endl;

    Header header (width, height);
    header.lineOrder ()   = lorder;
    header.compression () = comp;

    cout << "writing ";
    cout.flush ();

    {
        remove (fileName);
        RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);
        out.writePixels (height);
    }

    cout << "reading ";
    cout.flush ();

    {
        RgbaInputFile in (fileName);
        const Box2i&  dw = in.dataWindow ();

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        if (in.compression () == B44_COMPRESSION ||
            in.compression () == B44A_COMPRESSION)
        {
            compareB44 (width, height, p1, p2, channels);
        }
        else if (
            in.compression () == DWAA_COMPRESSION ||
            in.compression () == DWAB_COMPRESSION)
        {
            compareDwa (width, height, p1, p2, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    if (channels & WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (p2[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (p2[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (p2[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (p2[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}